

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O1

__pid_t __thiscall phosg::Subprocess::wait(Subprocess *this,void *__stat_loc)

{
  __pid_t _Var1;
  uint *puVar2;
  int iVar3;
  undefined1 auVar4 [12];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar3 = this->exit_status;
  if (iVar3 < 0) {
    do {
      _Var1 = waitpid(this->child_pid,&this->exit_status,(uint)__stat_loc & 0xff);
      if (_Var1 == -1) {
        puVar2 = (uint *)__errno_location();
        if (*puVar2 != 4) {
          auVar4 = __cxa_allocate_exception(0x10);
          string_for_error_abi_cxx11_(&local_70,(phosg *)(ulong)*puVar2,auVar4._8_4_);
          ::std::operator+(&local_50,"waitpid failed: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_70);
          ::std::runtime_error::runtime_error(auVar4._0_8_,(string *)&local_50);
          __cxa_throw(auVar4._0_8_,&::std::runtime_error::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
      }
      else if (_Var1 == 0) {
        iVar3 = -1;
      }
      else {
        if (_Var1 != this->child_pid) {
          __assert_fail("ret == this->child_pid",
                        "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/Process.cc"
                        ,0x1e0,"int phosg::Subprocess::wait(bool)");
        }
        iVar3 = this->exit_status;
      }
    } while (_Var1 == -1);
  }
  return iVar3;
}

Assistant:

int Subprocess::wait(bool poll) {
  if (this->exit_status >= 0) {
    return this->exit_status;
  }
  for (;;) {
    int ret = waitpid(this->child_pid, &this->exit_status, poll ? WNOHANG : 0);
    if (ret == -1) {
      if (errno != EINTR) {
        throw runtime_error("waitpid failed: " + string_for_error(errno));
      }
    } else if (ret == 0) {
      return -1; // not terminated yet
    } else {
      assert(ret == this->child_pid);
      return this->exit_status;
    }
  }
}